

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_guarded.hpp
# Opt level: O2

future<void> __thiscall gmlc::libguarded::void_runner<int>::get_future(void_runner<int> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  future<void> fVar1;
  handle local_28;
  
  guarded<std::packaged_task<void_(int_&)>,_std::mutex>::lock
            (&local_28,(guarded<std::packaged_task<void_(int_&)>,_std::mutex> *)(in_RSI + 8));
  std::packaged_task<void_(int_&)>::get_future((packaged_task<void_(int_&)> *)this);
  std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
  fVar1.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar1.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<void>)
         fVar1.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<void> get_future() { return task.lock()->get_future(); }